

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O0

bool __thiscall BamTools::Fasta::FastaPrivate::GetNextHeader(FastaPrivate *this,string *header)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string *in_RSI;
  undefined8 *in_RDI;
  stringstream headerBuffer;
  char buffer [1024];
  string local_5d0 [48];
  stringstream local_5a0 [16];
  ostream local_590 [376];
  char local_418 [1024];
  string *local_18;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    local_18 = in_RSI;
    iVar1 = feof((FILE *)*in_RDI);
    if (iVar1 == 0) {
      pcVar2 = fgets(local_418,0x400,(FILE *)*in_RDI);
      if (pcVar2 == (char *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"FASTA error : could not read from file");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      else if (local_418[0] == '>') {
        std::__cxx11::stringstream::stringstream(local_5a0);
        std::operator<<(local_590,local_418);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=(local_18,local_5d0);
        std::__cxx11::string::~string(local_5d0);
        local_1 = 1;
        std::__cxx11::stringstream::~stringstream(local_5a0);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "FASTA error : expected header (\'>\'), instead : ");
        poVar3 = std::operator<<(poVar3,local_418[0]);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      goto LAB_002b7067;
    }
  }
  local_1 = 0;
LAB_002b7067:
  return (bool)(local_1 & 1);
}

Assistant:

bool Fasta::FastaPrivate::GetNextHeader(std::string& header)
{

    // validate input stream
    if (!IsOpen || feof(Stream)) return false;

    // read in header line
    char buffer[1024];
    if (fgets(buffer, 1024, Stream) == 0) {
        std::cerr << "FASTA error : could not read from file" << std::endl;
        return false;
    }

    // make sure it's a FASTA header
    if (buffer[0] != '>') {
        std::cerr << "FASTA error : expected header ('>'), instead : " << buffer[0] << std::endl;
        return false;
    }

    // import buffer contents to header string
    std::stringstream headerBuffer;
    headerBuffer << buffer;
    header = headerBuffer.str();

    // return success
    return true;
}